

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O2

void __thiscall Disk::test(Disk *this)

{
  string *psVar1;
  string *this_00;
  ostream *poVar2;
  long lVar3;
  allocator local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  this_00 = (string *)operator_new(0x10000);
  Disk((Disk *)this_00);
  std::__cxx11::string::string(local_50,"2323",local_b0);
  psVar1 = this_00 + 0x1d40;
  std::__cxx11::string::_M_assign(psVar1);
  std::__cxx11::string::~string(local_50);
  poVar2 = std::operator<<((ostream *)&std::cout,"\n234: should be 4538:\t");
  std::__cxx11::string::string((string *)local_b0,psVar1);
  std::operator<<(poVar2,(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  poVar2 = std::operator<<((ostream *)&std::cout,"\n0: should be 0:\t");
  std::__cxx11::string::string((string *)local_b0,this_00);
  std::operator<<(poVar2,(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::string(local_70,"23232",local_b0);
  std::__cxx11::string::_M_assign(this_00 + 0x1d60);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_90,"34434",local_b0);
  std::__cxx11::string::_M_assign(psVar1);
  std::__cxx11::string::~string(local_90);
  poVar2 = std::operator<<((ostream *)&std::cout,"\n234: should be 2333:\t");
  std::__cxx11::string::string((string *)local_b0,psVar1);
  std::operator<<(poVar2,(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  poVar2 = std::operator<<((ostream *)&std::cout,"\n235: should be 12344:\t");
  std::__cxx11::string::string((string *)local_b0,this_00 + 0x1d60);
  std::operator<<(poVar2,(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  poVar2 = std::operator<<((ostream *)&std::cout,"\n236: should be 0:\t");
  std::__cxx11::string::string((string *)local_b0,this_00 + 0x1d80);
  std::operator<<(poVar2,(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  for (lVar3 = 0; lVar3 != 0x10000; lVar3 = lVar3 + 0x20) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             (string *)((long)&this->disk_data[0]._M_dataplus._M_p + lVar3));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void Disk::test() {
    Disk *disk = new Disk();
    disk->write(234, "2323");
    std::cout << "\n234: should be 4538:\t" << disk->read(234);
    std::cout << "\n0: should be 0:\t" << disk->read(0);
    disk->write(235, "23232");
    disk->write(234, "34434");
    std::cout << "\n234: should be 2333:\t" << disk->read(234);
    std::cout << "\n235: should be 12344:\t" << disk->read(235);
    std::cout << "\n236: should be 0:\t" << disk->read(236);
    for (int i = 0; i < 2048; i++)
        std::cout << disk_data[i] << std::endl;
}